

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O3

stCoSysEnvArr_t * dup_co_sysenv_arr(stCoSysEnvArr_t *arr)

{
  size_t sVar1;
  stCoSysEnvArr_t *psVar2;
  stCoSysEnv_t *__dest;
  size_t __nmemb;
  
  psVar2 = (stCoSysEnvArr_t *)calloc(0x10,1);
  sVar1 = _ZL11g_co_sysenv_1;
  if (_ZL11g_co_sysenv_1 != 0) {
    __nmemb = _ZL11g_co_sysenv_1 << 4;
    __dest = (stCoSysEnv_t *)calloc(__nmemb,1);
    psVar2->data = __dest;
    psVar2->cnt = sVar1;
    memcpy(__dest,_ZL11g_co_sysenv_0,__nmemb);
  }
  return psVar2;
}

Assistant:

static stCoSysEnvArr_t *dup_co_sysenv_arr( stCoSysEnvArr_t * arr )
{
	stCoSysEnvArr_t *lp = (stCoSysEnvArr_t*)calloc( sizeof(stCoSysEnvArr_t),1 );	
	if( arr->cnt )
	{
		lp->data = (stCoSysEnv_t*)calloc( sizeof(stCoSysEnv_t) * arr->cnt,1 );
		lp->cnt = arr->cnt;
		memcpy( lp->data,arr->data,sizeof( stCoSysEnv_t ) * arr->cnt );
	}
	return lp;
}